

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O3

bool requireDeviceLinking(cmGeneratorTarget *target,cmLocalGenerator *lg,string *config)

{
  PositionType *pPVar1;
  bool bVar2;
  byte bVar3;
  TargetType TVar4;
  cmGlobalGenerator *this;
  char *pcVar5;
  LinkClosure *pLVar6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  cmComputeLinkInformation *cli;
  cmLinkLineComputer *this_00;
  cmLinkLineDeviceComputer deviceLinkComputer;
  string cuda_lang;
  cmLinkLineComputer local_d0;
  long *local_90 [2];
  long local_80 [2];
  cmStateSnapshot local_70;
  cmStateDirectory local_58;
  
  this = cmGeneratorTarget::GetGlobalGenerator(target);
  pPVar1 = &local_d0.StateDir.DirectoryState.Position;
  local_d0._vptr_cmLinkLineComputer = (_func_int **)pPVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CUDA","");
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this,(string *)&local_d0);
  if (local_d0._vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
    operator_delete(local_d0._vptr_cmLinkLineComputer,local_d0.StateDir.DirectoryState.Position + 1)
    ;
  }
  if (bVar2) {
    TVar4 = cmGeneratorTarget::GetType(target);
    if (TVar4 != OBJECT_LIBRARY) {
      local_d0._vptr_cmLinkLineComputer = (_func_int **)pPVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"CUDA_RESOLVE_DEVICE_SYMBOLS","");
      pcVar5 = cmGeneratorTarget::GetProperty(target,(string *)&local_d0);
      if (local_d0._vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
        operator_delete(local_d0._vptr_cmLinkLineComputer,
                        local_d0.StateDir.DirectoryState.Position + 1);
      }
      if (pcVar5 != (char *)0x0) {
        bVar3 = cmSystemTools::IsOn(pcVar5);
        goto LAB_00344830;
      }
      local_d0._vptr_cmLinkLineComputer = (_func_int **)pPVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"CUDA_SEPARABLE_COMPILATION","");
      pcVar5 = cmGeneratorTarget::GetProperty(target,(string *)&local_d0);
      if (local_d0._vptr_cmLinkLineComputer != (_func_int **)pPVar1) {
        operator_delete(local_d0._vptr_cmLinkLineComputer,
                        local_d0.StateDir.DirectoryState.Position + 1);
      }
      if (pcVar5 != (char *)0x0) {
        bVar2 = cmSystemTools::IsOn(pcVar5);
        if (bVar2) {
          TVar4 = cmGeneratorTarget::GetType(target);
          if (TVar4 < OBJECT_LIBRARY) {
            bVar3 = 0xd >> ((byte)TVar4 & 0xf);
            goto LAB_00344830;
          }
          goto LAB_0034482e;
        }
      }
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CUDA","");
      pLVar6 = cmGeneratorTarget::GetLinkClosure(target,config);
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pLVar6->Languages).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pLVar6->Languages).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,local_90);
      if (_Var7._M_current ==
          (pLVar6->Languages).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar3 = false;
      }
      else {
        cli = cmGeneratorTarget::GetLinkInformation(target,config);
        if (cli == (cmComputeLinkInformation *)0x0) {
          bVar3 = true;
        }
        else {
          cmLocalGenerator::GetStateSnapshot(&local_70,lg);
          cmStateSnapshot::GetDirectory(&local_58,&local_70);
          this_00 = &local_d0;
          cmLinkLineComputer::cmLinkLineComputer(this_00,&lg->super_cmOutputConverter,&local_58);
          local_d0._vptr_cmLinkLineComputer = (_func_int **)&PTR__cmLinkLineDeviceComputer_00673440;
          bVar3 = cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
                            ((cmLinkLineDeviceComputer *)this_00,cli);
          cmLinkLineComputer::~cmLinkLineComputer(&local_d0);
        }
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      goto LAB_00344830;
    }
  }
LAB_0034482e:
  bVar3 = 0;
LAB_00344830:
  return (bool)(bVar3 & 1);
}

Assistant:

bool requireDeviceLinking(cmGeneratorTarget& target, cmLocalGenerator& lg,
                          const std::string& config)
{
  if (!target.GetGlobalGenerator()->GetLanguageEnabled("CUDA")) {
    return false;
  }

  if (target.GetType() == cmStateEnums::OBJECT_LIBRARY) {
    return false;
  }

  if (const char* resolveDeviceSymbols =
        target.GetProperty("CUDA_RESOLVE_DEVICE_SYMBOLS")) {
    // If CUDA_RESOLVE_DEVICE_SYMBOLS has been explicitly set we need
    // to honor the value no matter what it is.
    return cmSystemTools::IsOn(resolveDeviceSymbols);
  }

  if (const char* separableCompilation =
        target.GetProperty("CUDA_SEPARABLE_COMPILATION")) {
    if (cmSystemTools::IsOn(separableCompilation)) {
      bool doDeviceLinking = false;
      switch (target.GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::EXECUTABLE:
          doDeviceLinking = true;
          break;
        default:
          break;
      }
      return doDeviceLinking;
    }
  }

  // Determine if we have any dependencies that require
  // us to do a device link step
  const std::string cuda_lang("CUDA");
  cmGeneratorTarget::LinkClosure const* closure =
    target.GetLinkClosure(config);

  bool closureHasCUDA =
    (std::find(closure->Languages.begin(), closure->Languages.end(),
               cuda_lang) != closure->Languages.end());
  if (closureHasCUDA) {
    cmComputeLinkInformation* pcli = target.GetLinkInformation(config);
    if (pcli) {
      cmLinkLineDeviceComputer deviceLinkComputer(
        &lg, lg.GetStateSnapshot().GetDirectory());
      return deviceLinkComputer.ComputeRequiresDeviceLinking(*pcli);
    }
    return true;
  }
  return false;
}